

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O0

void __thiscall BackwardPass::RemoveEmptyLoops(BackwardPass *this)

{
  Loop *pLVar1;
  bool bVar2;
  uint sourceContextId;
  uint functionId;
  Loop *local_28;
  Loop *loop;
  Loop *loopNext;
  anon_class_8_1_8991fb9c DeleteMemOpInfo;
  BackwardPass *this_local;
  
  DeleteMemOpInfo.this = this;
  sourceContextId = Func::GetSourceContextId(this->func);
  functionId = Func::GetLocalFunctionId(this->func);
  bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01eafdf0,MemOpPhase,sourceContextId,functionId);
  if (!bVar2) {
    local_28 = this->func->m_fg->loopList;
    loopNext = (Loop *)this;
    while (local_28 != (Loop *)0x0) {
      pLVar1 = local_28->next;
      bVar2 = IsEmptyLoopAfterMemOp(this,local_28);
      if (bVar2) {
        RestoreInductionVariableValuesAfterMemOp(this,local_28);
        RemoveEmptyLoopAfterMemOp(this,local_28);
      }
      RemoveEmptyLoops::anon_class_8_1_8991fb9c::operator()
                ((anon_class_8_1_8991fb9c *)&loopNext,local_28);
      local_28 = pLVar1;
    }
  }
  return;
}

Assistant:

void
BackwardPass::RemoveEmptyLoops()
{
    if (PHASE_OFF(Js::MemOpPhase, this->func))
    {
        return;

    }
    const auto DeleteMemOpInfo = [&](Loop *loop)
    {
        JitArenaAllocator *alloc = this->func->GetTopFunc()->m_fg->alloc;

        if (!loop->memOpInfo)
        {
            return;
        }

        if (loop->memOpInfo->candidates)
        {
            loop->memOpInfo->candidates->Clear();
            JitAdelete(alloc, loop->memOpInfo->candidates);
        }

        if (loop->memOpInfo->inductionVariableChangeInfoMap)
        {
            loop->memOpInfo->inductionVariableChangeInfoMap->Clear();
            JitAdelete(alloc, loop->memOpInfo->inductionVariableChangeInfoMap);
        }

        if (loop->memOpInfo->inductionVariableOpndPerUnrollMap)
        {
            loop->memOpInfo->inductionVariableOpndPerUnrollMap->Clear();
            JitAdelete(alloc, loop->memOpInfo->inductionVariableOpndPerUnrollMap);
        }

        if (loop->memOpInfo->inductionVariablesUsedAfterLoop)
        {
            JitAdelete(this->tempAlloc, loop->memOpInfo->inductionVariablesUsedAfterLoop);
        }
        JitAdelete(alloc, loop->memOpInfo);
    };

    FOREACH_LOOP_IN_FUNC_EDITING(loop, this->func)
    {
        if (IsEmptyLoopAfterMemOp(loop))
        {
            RestoreInductionVariableValuesAfterMemOp(loop);
            RemoveEmptyLoopAfterMemOp(loop);
        }
        // Remove memop info as we don't need them after this point.
        DeleteMemOpInfo(loop);

    } NEXT_LOOP_IN_FUNC_EDITING;

}